

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::decode_payload
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool concurrent_local;
  Entry *entry_local;
  size_t blob_size_local;
  void *blob_local;
  StreamArchive *this_local;
  
  if ((entry->header).format == 1) {
    this_local._7_1_ = decode_payload_uncompressed(this,blob,blob_size,entry,concurrent);
  }
  else if ((entry->header).format == 2) {
    this_local._7_1_ = decode_payload_deflate(this,blob,blob_size,entry,concurrent);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool decode_payload(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.format == FOSSILIZE_COMPRESSION_NONE)
			return decode_payload_uncompressed(blob, blob_size, entry, concurrent);
		else if (entry.header.format == FOSSILIZE_COMPRESSION_DEFLATE)
			return decode_payload_deflate(blob, blob_size, entry, concurrent);
		else
			return false;
	}